

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnGetGlobalExpr
          (ExprVisitorDelegate *this,GetGlobalExpr *expr)

{
  WatWriter *this_00;
  Info local_50;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_50,(Opcode *)&Opcode::GetGlobal_Opcode);
  WritePuts(this_00,local_50.name,Space);
  WriteVar(this->writer_,&expr->var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnGetGlobalExpr(GetGlobalExpr* expr) {
  writer_->WritePutsSpace(Opcode::GetGlobal_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Newline);
  return Result::Ok;
}